

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

TypeId __thiscall
Js::JavascriptNativeIntArray::TrySetNativeIntArrayItem
          (JavascriptNativeIntArray *this,Var value,int32 *iValue,double *dValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_38;
  bool local_31;
  int32 i;
  bool isInt32;
  
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)value >> 0x32 != 0) {
        bVar2 = JavascriptNumber::TryGetInt32OrUInt32Value
                          ((double)((ulong)value ^ 0xfffc000000000000),&local_38,&local_31);
        if (!bVar2) {
          *dValue = (double)((ulong)value ^ 0xfffc000000000000);
          ToNativeFloatArray(this);
          return TypeIds_ArrayLast;
        }
        if ((local_38 != -0x7fffe & local_31) == 1) {
          *iValue = local_38;
          return TypeIds_NativeIntArray;
        }
      }
      goto LAB_00b70896;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b708c5;
    *puVar3 = 0;
  }
  if (((ulong)value & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00b708c5:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((int)value != -0x7fffe) {
    *iValue = (int)value;
    return TypeIds_NativeIntArray;
  }
LAB_00b70896:
  ToVarArray(this);
  return TypeIds_Array;
}

Assistant:

TypeId JavascriptNativeIntArray::TrySetNativeIntArrayItem(Var value, int32 *iValue, double *dValue)
    {
        if (TaggedInt::Is(value))
        {
            int32 i = TaggedInt::ToInt32(value);
            if (i != JavascriptNativeIntArray::MissingItem)
            {
                *iValue = i;
                return TypeIds_NativeIntArray;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(value))
        {
            bool isInt32;
            int32 i;
            double d = JavascriptNumber::GetValue(value);
            if (JavascriptNumber::TryGetInt32OrUInt32Value(d, &i, &isInt32))
            {
                if (isInt32 && i != JavascriptNativeIntArray::MissingItem)
                {
                    *iValue = i;
                    return TypeIds_NativeIntArray;
                }
            }
            else
            {
                *dValue = d;
                JavascriptNativeIntArray::ToNativeFloatArray(this);
                return TypeIds_NativeFloatArray;
            }
        }

        JavascriptNativeIntArray::ToVarArray(this);
        return TypeIds_Array;
    }